

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O1

void __thiscall ValidateDamageBin::ReadDamageBinDictFile(ValidateDamageBin *this,bool convertToBin)

{
  damagebindictionary *__ptr;
  OASIS_FLOAT *pOVar1;
  OASIS_FLOAT *pOVar2;
  OASIS_FLOAT *pOVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  int *piVar11;
  
  pcVar9 = fgets((char *)this,0x1000,_stdin);
  if (pcVar9 != (char *)0x0) {
    __ptr = &this->dbd_;
    pOVar1 = &(this->dbd_).bin_from;
    pOVar2 = &(this->dbd_).bin_to;
    pOVar3 = &(this->dbd_).interpolation;
    piVar4 = &(this->dbd_).interval_type;
    piVar11 = &(this->super_Validate).lineno_;
    do {
      iVar8 = __isoc99_sscanf(this,"%d,%f,%f,%f,%d",__ptr,pOVar1,pOVar2,pOVar3,piVar4);
      if (iVar8 == 5) {
        if (this->newFormat_ == true) {
          ReadDamageBinDictFile();
        }
      }
      else {
        iVar8 = __isoc99_sscanf(this,"%d,%f,%f,%f",__ptr,pOVar1,pOVar2,pOVar3,piVar11);
        if (iVar8 == 4) {
          if (this->newFormat_ == false) {
            ReadDamageBinDictFile();
          }
          *piVar4 = 0;
        }
        else {
          ReadDamageBinDictFile();
        }
      }
      uVar6 = (this->dbd_).bin_index;
      if (this->prevBinIndex_ != uVar6 - 1) {
        uVar7 = (this->super_Validate).lineno_;
        fprintf(_stderr,
                "ERROR: Non-contiguous bin indices %d on line %d and %d on line %d:\n%s\n%s\n",
                (ulong)(uint)this->prevBinIndex_,(ulong)(uVar7 - 1),(ulong)uVar6,(ulong)uVar7,
                this->prevLine_,this);
        Validate::PrintErrorMessage(&this->super_Validate);
      }
      CheckInterpolationDamageValuesWithinRange(this);
      piVar5 = &(this->super_Validate).lineno_;
      *piVar5 = *piVar5 + 1;
      this->prevBinIndex_ = (this->dbd_).bin_index;
      sVar10 = strlen((char *)this);
      memcpy(this->prevLine_,this,sVar10 + 1);
      sVar10 = strlen((char *)this);
      this->prevLine_[sVar10 - 1] = '\0';
      if (convertToBin) {
        fwrite(__ptr,0x14,1,_stdout);
      }
      pcVar9 = fgets((char *)this,0x1000,_stdin);
    } while (pcVar9 != (char *)0x0);
  }
  return;
}

Assistant:

void ValidateDamageBin::ReadDamageBinDictFile(const bool convertToBin) {
/* After reading in a line from the csv file and checking for data integrity,
 * this method calls other methods to check for contiguous bin indices and
 * whether the interpolation value lies within the defined range. */

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanDeprecatedFormat() == 5) {

      if (newFormat_) {

        fprintf(stderr, "ERROR: Deprecated format used in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

    } else if (ScanNewFormat() == 4) {

      if (!newFormat_) {

        fprintf(stderr, "ERROR: Missing interval type column in line %d:\n%s\n",
                lineno_, line_);
        PrintErrorMessage();

      }

      dbd_.interval_type = 0;

    } else {

      fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
      PrintErrorMessage();

    }

    CheckContiguousBinIndices();
    CheckInterpolationDamageValuesWithinRange();
    StoreLine();
    if (convertToBin) ConvertToBin();

  }

}